

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glew.c
# Opt level: O2

GLboolean glxewIsSupported(char *name)

{
  GLboolean GVar1;
  GLboolean GVar2;
  GLuint len;
  GLubyte *pos;
  
  pos = (GLubyte *)name;
  len = _glewStrLen((GLubyte *)name);
  GVar1 = '\x01';
LAB_001928a3:
  if ((GVar1 == '\0') || (len == 0)) {
    return GVar1;
  }
  GVar1 = _glewStrSame1(&pos,&len,(GLubyte *)"GLX_",4);
  if (GVar1 != '\0') goto code_r0x001928cb;
  goto LAB_001934a5;
code_r0x001928cb:
  GVar1 = _glewStrSame2(&pos,&len,(GLubyte *)"VERSION_",8);
  if ((((GVar1 == '\0') ||
       (((GVar2 = _glewStrSame3(&pos,&len,"1_2",3), GVar1 = __GLXEW_VERSION_1_2, GVar2 == '\0' &&
         (GVar2 = _glewStrSame3(&pos,&len,"1_3",3), GVar1 = __GLXEW_VERSION_1_3, GVar2 == '\0')) &&
        (GVar2 = _glewStrSame3(&pos,&len,"1_4",3), GVar1 = __GLXEW_VERSION_1_4, GVar2 == '\0')))) &&
      (((GVar1 = _glewStrSame2(&pos,&len,(GLubyte *)"3DFX_",5), GVar1 == '\0' ||
        (GVar2 = _glewStrSame3(&pos,&len,"multisample",0xb), GVar1 = __GLXEW_3DFX_multisample,
        GVar2 == '\0')) &&
       ((GVar1 = _glewStrSame2(&pos,&len,(GLubyte *)"AMD_",4), GVar1 == '\0' ||
        (GVar2 = _glewStrSame3(&pos,&len,"gpu_association",0xf), GVar1 = __GLXEW_AMD_gpu_association
        , GVar2 == '\0')))))) &&
     ((((GVar1 = _glewStrSame2(&pos,&len,(GLubyte *)"ARB_",4), GVar1 == '\0' ||
        ((((((GVar2 = _glewStrSame3(&pos,&len,"context_flush_control",0x15),
             GVar1 = __GLXEW_ARB_context_flush_control, GVar2 == '\0' &&
             (GVar2 = _glewStrSame3(&pos,&len,"create_context",0xe),
             GVar1 = __GLXEW_ARB_create_context, GVar2 == '\0')) &&
            ((GVar2 = _glewStrSame3(&pos,&len,"create_context_no_error",0x17),
             GVar1 = __GLXEW_ARB_create_context_no_error, GVar2 == '\0' &&
             ((((GVar2 = _glewStrSame3(&pos,&len,"create_context_profile",0x16),
                GVar1 = __GLXEW_ARB_create_context_profile, GVar2 == '\0' &&
                (GVar2 = _glewStrSame3(&pos,&len,"create_context_robustness",0x19),
                GVar1 = __GLXEW_ARB_create_context_robustness, GVar2 == '\0')) &&
               (GVar2 = _glewStrSame3(&pos,&len,"fbconfig_float",0xe),
               GVar1 = __GLXEW_ARB_fbconfig_float, GVar2 == '\0')) &&
              ((GVar2 = _glewStrSame3(&pos,&len,"framebuffer_sRGB",0x10),
               GVar1 = __GLXEW_ARB_framebuffer_sRGB, GVar2 == '\0' &&
               (GVar2 = _glewStrSame3(&pos,&len,"get_proc_address",0x10),
               GVar1 = __GLXEW_ARB_get_proc_address, GVar2 == '\0')))))))) &&
           (GVar2 = _glewStrSame3(&pos,&len,"multisample",0xb), GVar1 = __GLXEW_ARB_multisample,
           GVar2 == '\0')) &&
          ((GVar2 = _glewStrSame3(&pos,&len,"robustness_application_isolation",0x20),
           GVar1 = __GLXEW_ARB_robustness_application_isolation, GVar2 == '\0' &&
           (GVar2 = _glewStrSame3(&pos,&len,"robustness_share_group_isolation",0x20),
           GVar1 = __GLXEW_ARB_robustness_share_group_isolation, GVar2 == '\0')))) &&
         (GVar2 = _glewStrSame3(&pos,&len,"vertex_buffer_object",0x14),
         GVar1 = __GLXEW_ARB_vertex_buffer_object, GVar2 == '\0')))) &&
       ((GVar1 = _glewStrSame2(&pos,&len,(GLubyte *)"ATI_",4), GVar1 == '\0' ||
        ((GVar2 = _glewStrSame3(&pos,&len,"pixel_format_float",0x12),
         GVar1 = __GLXEW_ATI_pixel_format_float, GVar2 == '\0' &&
         (GVar2 = _glewStrSame3(&pos,&len,"render_texture",0xe), GVar1 = __GLXEW_ATI_render_texture,
         GVar2 == '\0')))))) &&
      ((GVar1 = _glewStrSame2(&pos,&len,(GLubyte *)"EXT_",4), GVar1 == '\0' ||
       ((((((GVar2 = _glewStrSame3(&pos,&len,"buffer_age",10), GVar1 = __GLXEW_EXT_buffer_age,
            GVar2 == '\0' &&
            (GVar2 = _glewStrSame3(&pos,&len,"create_context_es2_profile",0x1a),
            GVar1 = __GLXEW_EXT_create_context_es2_profile, GVar2 == '\0')) &&
           (GVar2 = _glewStrSame3(&pos,&len,"create_context_es_profile",0x19),
           GVar1 = __GLXEW_EXT_create_context_es_profile, GVar2 == '\0')) &&
          (((GVar2 = _glewStrSame3(&pos,&len,"fbconfig_packed_float",0x15),
            GVar1 = __GLXEW_EXT_fbconfig_packed_float, GVar2 == '\0' &&
            (GVar2 = _glewStrSame3(&pos,&len,"framebuffer_sRGB",0x10),
            GVar1 = __GLXEW_EXT_framebuffer_sRGB, GVar2 == '\0')) &&
           ((GVar2 = _glewStrSame3(&pos,&len,"import_context",0xe),
            GVar1 = __GLXEW_EXT_import_context, GVar2 == '\0' &&
            ((GVar2 = _glewStrSame3(&pos,&len,"libglvnd",8), GVar1 = __GLXEW_EXT_libglvnd,
             GVar2 == '\0' &&
             (GVar2 = _glewStrSame3(&pos,&len,"scene_marker",0xc), GVar1 = __GLXEW_EXT_scene_marker,
             GVar2 == '\0')))))))) &&
         (GVar2 = _glewStrSame3(&pos,&len,"stereo_tree",0xb), GVar1 = __GLXEW_EXT_stereo_tree,
         GVar2 == '\0')) &&
        ((((GVar2 = _glewStrSame3(&pos,&len,"swap_control",0xc), GVar1 = __GLXEW_EXT_swap_control,
           GVar2 == '\0' &&
           (GVar2 = _glewStrSame3(&pos,&len,"swap_control_tear",0x11),
           GVar1 = __GLXEW_EXT_swap_control_tear, GVar2 == '\0')) &&
          (GVar2 = _glewStrSame3(&pos,&len,"texture_from_pixmap",0x13),
          GVar1 = __GLXEW_EXT_texture_from_pixmap, GVar2 == '\0')) &&
         ((GVar2 = _glewStrSame3(&pos,&len,"visual_info",0xb), GVar1 = __GLXEW_EXT_visual_info,
          GVar2 == '\0' &&
          (GVar2 = _glewStrSame3(&pos,&len,"visual_rating",0xd), GVar1 = __GLXEW_EXT_visual_rating,
          GVar2 == '\0')))))))))))) {
    GVar1 = _glewStrSame2(&pos,&len,(GLubyte *)"INTEL_",6);
    if ((((GVar1 == '\0') ||
         (GVar2 = _glewStrSame3(&pos,&len,"swap_event",10), GVar1 = __GLXEW_INTEL_swap_event,
         GVar2 == '\0')) &&
        ((GVar1 = _glewStrSame2(&pos,&len,(GLubyte *)"MESA_",5), GVar1 == '\0' ||
         (((GVar2 = _glewStrSame3(&pos,&len,"agp_offset",10), GVar1 = __GLXEW_MESA_agp_offset,
           GVar2 == '\0' &&
           (GVar2 = _glewStrSame3(&pos,&len,"copy_sub_buffer",0xf),
           GVar1 = __GLXEW_MESA_copy_sub_buffer, GVar2 == '\0')) &&
          ((GVar2 = _glewStrSame3(&pos,&len,"pixmap_colormap",0xf),
           GVar1 = __GLXEW_MESA_pixmap_colormap, GVar2 == '\0' &&
           ((((GVar2 = _glewStrSame3(&pos,&len,"query_renderer",0xe),
              GVar1 = __GLXEW_MESA_query_renderer, GVar2 == '\0' &&
              (GVar2 = _glewStrSame3(&pos,&len,"release_buffers",0xf),
              GVar1 = __GLXEW_MESA_release_buffers, GVar2 == '\0')) &&
             (GVar2 = _glewStrSame3(&pos,&len,"set_3dfx_mode",0xd),
             GVar1 = __GLXEW_MESA_set_3dfx_mode, GVar2 == '\0')) &&
            (GVar2 = _glewStrSame3(&pos,&len,"swap_control",0xc), GVar1 = __GLXEW_MESA_swap_control,
            GVar2 == '\0')))))))))) &&
       ((GVar1 = _glewStrSame2(&pos,&len,(GLubyte *)"NV_",3), GVar1 == '\0' ||
        ((((GVar2 = _glewStrSame3(&pos,&len,"copy_buffer",0xb), GVar1 = __GLXEW_NV_copy_buffer,
           GVar2 == '\0' &&
           (GVar2 = _glewStrSame3(&pos,&len,"copy_image",10), GVar1 = __GLXEW_NV_copy_image,
           GVar2 == '\0')) &&
          (((GVar2 = _glewStrSame3(&pos,&len,"delay_before_swap",0x11),
            GVar1 = __GLXEW_NV_delay_before_swap, GVar2 == '\0' &&
            ((GVar2 = _glewStrSame3(&pos,&len,"float_buffer",0xc), GVar1 = __GLXEW_NV_float_buffer,
             GVar2 == '\0' &&
             (GVar2 = _glewStrSame3(&pos,&len,"multisample_coverage",0x14),
             GVar1 = __GLXEW_NV_multisample_coverage, GVar2 == '\0')))) &&
           (GVar2 = _glewStrSame3(&pos,&len,"present_video",0xd), GVar1 = __GLXEW_NV_present_video,
           GVar2 == '\0')))) &&
         ((((GVar2 = _glewStrSame3(&pos,&len,"robustness_video_memory_purge",0x1d),
            GVar1 = __GLXEW_NV_robustness_video_memory_purge, GVar2 == '\0' &&
            (GVar2 = _glewStrSame3(&pos,&len,"swap_group",10), GVar1 = __GLXEW_NV_swap_group,
            GVar2 == '\0')) &&
           (GVar2 = _glewStrSame3(&pos,&len,"vertex_array_range",0x12),
           GVar1 = __GLXEW_NV_vertex_array_range, GVar2 == '\0')) &&
          ((GVar2 = _glewStrSame3(&pos,&len,"video_capture",0xd), GVar1 = __GLXEW_NV_video_capture,
           GVar2 == '\0' &&
           (GVar2 = _glewStrSame3(&pos,&len,"video_out",9), GVar1 = __GLXEW_NV_video_out,
           GVar2 == '\0')))))))))) {
      GVar1 = _glewStrSame2(&pos,&len,(GLubyte *)"OML_",4);
      if ((((GVar1 == '\0') ||
           ((GVar2 = _glewStrSame3(&pos,&len,"swap_method",0xb), GVar1 = __GLXEW_OML_swap_method,
            GVar2 == '\0' &&
            (GVar2 = _glewStrSame3(&pos,&len,"sync_control",0xc), GVar1 = __GLXEW_OML_sync_control,
            GVar2 == '\0')))) &&
          ((GVar1 = _glewStrSame2(&pos,&len,(GLubyte *)"SGIS_",5), GVar1 == '\0' ||
           ((((GVar2 = _glewStrSame3(&pos,&len,"blended_overlay",0xf),
              GVar1 = __GLXEW_SGIS_blended_overlay, GVar2 == '\0' &&
              (GVar2 = _glewStrSame3(&pos,&len,"color_range",0xb), GVar1 = __GLXEW_SGIS_color_range,
              GVar2 == '\0')) &&
             (GVar2 = _glewStrSame3(&pos,&len,"multisample",0xb), GVar1 = __GLXEW_SGIS_multisample,
             GVar2 == '\0')) &&
            (GVar2 = _glewStrSame3(&pos,&len,"shared_multisample",0x12),
            GVar1 = __GLXEW_SGIS_shared_multisample, GVar2 == '\0')))))) &&
         ((GVar1 = _glewStrSame2(&pos,&len,(GLubyte *)"SGIX_",5), GVar1 == '\0' ||
          ((((GVar2 = _glewStrSame3(&pos,&len,"fbconfig",8), GVar1 = __GLXEW_SGIX_fbconfig,
             GVar2 == '\0' &&
             (GVar2 = _glewStrSame3(&pos,&len,"hyperpipe",9), GVar1 = __GLXEW_SGIX_hyperpipe,
             GVar2 == '\0')) &&
            ((GVar2 = _glewStrSame3(&pos,&len,"pbuffer",7), GVar1 = __GLXEW_SGIX_pbuffer,
             GVar2 == '\0' &&
             ((GVar2 = _glewStrSame3(&pos,&len,"swap_barrier",0xc),
              GVar1 = __GLXEW_SGIX_swap_barrier, GVar2 == '\0' &&
              (GVar2 = _glewStrSame3(&pos,&len,"swap_group",10), GVar1 = __GLXEW_SGIX_swap_group,
              GVar2 == '\0')))))) &&
           ((GVar2 = _glewStrSame3(&pos,&len,"video_resize",0xc), GVar1 = __GLXEW_SGIX_video_resize,
            GVar2 == '\0' &&
            (GVar2 = _glewStrSame3(&pos,&len,"visual_select_group",0x13),
            GVar1 = __GLXEW_SGIX_visual_select_group, GVar2 == '\0')))))))) {
        GVar1 = _glewStrSame2(&pos,&len,(GLubyte *)"SGI_",4);
        if (((GVar1 == '\0') ||
            ((((GVar2 = _glewStrSame3(&pos,&len,"cushion",7), GVar1 = __GLXEW_SGI_cushion,
               GVar2 == '\0' &&
               (GVar2 = _glewStrSame3(&pos,&len,"make_current_read",0x11),
               GVar1 = __GLXEW_SGI_make_current_read, GVar2 == '\0')) &&
              (GVar2 = _glewStrSame3(&pos,&len,"swap_control",0xc), GVar1 = __GLXEW_SGI_swap_control
              , GVar2 == '\0')) &&
             (GVar2 = _glewStrSame3(&pos,&len,"video_sync",10), GVar1 = __GLXEW_SGI_video_sync,
             GVar2 == '\0')))) &&
           ((GVar1 = _glewStrSame2(&pos,&len,(GLubyte *)"SUN_",4), GVar1 == '\0' ||
            ((GVar2 = _glewStrSame3(&pos,&len,"get_transparent_index",0x15),
             GVar1 = __GLXEW_SUN_get_transparent_index, GVar2 == '\0' &&
             (GVar2 = _glewStrSame3(&pos,&len,"video_resize",0xc), GVar1 = __GLXEW_SUN_video_resize,
             GVar2 == '\0')))))) {
LAB_001934a5:
          GVar1 = len == 0;
        }
      }
    }
  }
  goto LAB_001928a3;
}

Assistant:

GLboolean glxewIsSupported (const char* name)
{
  const GLubyte* pos = (const GLubyte*)name;
  GLuint len = _glewStrLen(pos);
  GLboolean ret = GL_TRUE;
  while (ret && len > 0)
  {
    if(_glewStrSame1(&pos, &len, (const GLubyte*)"GLX_", 4))
    {
      if (_glewStrSame2(&pos, &len, (const GLubyte*)"VERSION_", 8))
      {
#ifdef GLX_VERSION_1_2
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"1_2", 3))
        {
          ret = GLXEW_VERSION_1_2;
          continue;
        }
#endif
#ifdef GLX_VERSION_1_3
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"1_3", 3))
        {
          ret = GLXEW_VERSION_1_3;
          continue;
        }
#endif
#ifdef GLX_VERSION_1_4
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"1_4", 3))
        {
          ret = GLXEW_VERSION_1_4;
          continue;
        }
#endif
      }
      if (_glewStrSame2(&pos, &len, (const GLubyte*)"3DFX_", 5))
      {
#ifdef GLX_3DFX_multisample
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"multisample", 11))
        {
          ret = GLXEW_3DFX_multisample;
          continue;
        }
#endif
      }
      if (_glewStrSame2(&pos, &len, (const GLubyte*)"AMD_", 4))
      {
#ifdef GLX_AMD_gpu_association
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"gpu_association", 15))
        {
          ret = GLXEW_AMD_gpu_association;
          continue;
        }
#endif
      }
      if (_glewStrSame2(&pos, &len, (const GLubyte*)"ARB_", 4))
      {
#ifdef GLX_ARB_context_flush_control
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"context_flush_control", 21))
        {
          ret = GLXEW_ARB_context_flush_control;
          continue;
        }
#endif
#ifdef GLX_ARB_create_context
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"create_context", 14))
        {
          ret = GLXEW_ARB_create_context;
          continue;
        }
#endif
#ifdef GLX_ARB_create_context_no_error
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"create_context_no_error", 23))
        {
          ret = GLXEW_ARB_create_context_no_error;
          continue;
        }
#endif
#ifdef GLX_ARB_create_context_profile
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"create_context_profile", 22))
        {
          ret = GLXEW_ARB_create_context_profile;
          continue;
        }
#endif
#ifdef GLX_ARB_create_context_robustness
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"create_context_robustness", 25))
        {
          ret = GLXEW_ARB_create_context_robustness;
          continue;
        }
#endif
#ifdef GLX_ARB_fbconfig_float
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"fbconfig_float", 14))
        {
          ret = GLXEW_ARB_fbconfig_float;
          continue;
        }
#endif
#ifdef GLX_ARB_framebuffer_sRGB
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"framebuffer_sRGB", 16))
        {
          ret = GLXEW_ARB_framebuffer_sRGB;
          continue;
        }
#endif
#ifdef GLX_ARB_get_proc_address
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"get_proc_address", 16))
        {
          ret = GLXEW_ARB_get_proc_address;
          continue;
        }
#endif
#ifdef GLX_ARB_multisample
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"multisample", 11))
        {
          ret = GLXEW_ARB_multisample;
          continue;
        }
#endif
#ifdef GLX_ARB_robustness_application_isolation
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"robustness_application_isolation", 32))
        {
          ret = GLXEW_ARB_robustness_application_isolation;
          continue;
        }
#endif
#ifdef GLX_ARB_robustness_share_group_isolation
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"robustness_share_group_isolation", 32))
        {
          ret = GLXEW_ARB_robustness_share_group_isolation;
          continue;
        }
#endif
#ifdef GLX_ARB_vertex_buffer_object
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"vertex_buffer_object", 20))
        {
          ret = GLXEW_ARB_vertex_buffer_object;
          continue;
        }
#endif
      }
      if (_glewStrSame2(&pos, &len, (const GLubyte*)"ATI_", 4))
      {
#ifdef GLX_ATI_pixel_format_float
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"pixel_format_float", 18))
        {
          ret = GLXEW_ATI_pixel_format_float;
          continue;
        }
#endif
#ifdef GLX_ATI_render_texture
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"render_texture", 14))
        {
          ret = GLXEW_ATI_render_texture;
          continue;
        }
#endif
      }
      if (_glewStrSame2(&pos, &len, (const GLubyte*)"EXT_", 4))
      {
#ifdef GLX_EXT_buffer_age
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"buffer_age", 10))
        {
          ret = GLXEW_EXT_buffer_age;
          continue;
        }
#endif
#ifdef GLX_EXT_create_context_es2_profile
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"create_context_es2_profile", 26))
        {
          ret = GLXEW_EXT_create_context_es2_profile;
          continue;
        }
#endif
#ifdef GLX_EXT_create_context_es_profile
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"create_context_es_profile", 25))
        {
          ret = GLXEW_EXT_create_context_es_profile;
          continue;
        }
#endif
#ifdef GLX_EXT_fbconfig_packed_float
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"fbconfig_packed_float", 21))
        {
          ret = GLXEW_EXT_fbconfig_packed_float;
          continue;
        }
#endif
#ifdef GLX_EXT_framebuffer_sRGB
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"framebuffer_sRGB", 16))
        {
          ret = GLXEW_EXT_framebuffer_sRGB;
          continue;
        }
#endif
#ifdef GLX_EXT_import_context
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"import_context", 14))
        {
          ret = GLXEW_EXT_import_context;
          continue;
        }
#endif
#ifdef GLX_EXT_libglvnd
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"libglvnd", 8))
        {
          ret = GLXEW_EXT_libglvnd;
          continue;
        }
#endif
#ifdef GLX_EXT_scene_marker
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"scene_marker", 12))
        {
          ret = GLXEW_EXT_scene_marker;
          continue;
        }
#endif
#ifdef GLX_EXT_stereo_tree
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"stereo_tree", 11))
        {
          ret = GLXEW_EXT_stereo_tree;
          continue;
        }
#endif
#ifdef GLX_EXT_swap_control
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"swap_control", 12))
        {
          ret = GLXEW_EXT_swap_control;
          continue;
        }
#endif
#ifdef GLX_EXT_swap_control_tear
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"swap_control_tear", 17))
        {
          ret = GLXEW_EXT_swap_control_tear;
          continue;
        }
#endif
#ifdef GLX_EXT_texture_from_pixmap
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"texture_from_pixmap", 19))
        {
          ret = GLXEW_EXT_texture_from_pixmap;
          continue;
        }
#endif
#ifdef GLX_EXT_visual_info
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"visual_info", 11))
        {
          ret = GLXEW_EXT_visual_info;
          continue;
        }
#endif
#ifdef GLX_EXT_visual_rating
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"visual_rating", 13))
        {
          ret = GLXEW_EXT_visual_rating;
          continue;
        }
#endif
      }
      if (_glewStrSame2(&pos, &len, (const GLubyte*)"INTEL_", 6))
      {
#ifdef GLX_INTEL_swap_event
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"swap_event", 10))
        {
          ret = GLXEW_INTEL_swap_event;
          continue;
        }
#endif
      }
      if (_glewStrSame2(&pos, &len, (const GLubyte*)"MESA_", 5))
      {
#ifdef GLX_MESA_agp_offset
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"agp_offset", 10))
        {
          ret = GLXEW_MESA_agp_offset;
          continue;
        }
#endif
#ifdef GLX_MESA_copy_sub_buffer
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"copy_sub_buffer", 15))
        {
          ret = GLXEW_MESA_copy_sub_buffer;
          continue;
        }
#endif
#ifdef GLX_MESA_pixmap_colormap
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"pixmap_colormap", 15))
        {
          ret = GLXEW_MESA_pixmap_colormap;
          continue;
        }
#endif
#ifdef GLX_MESA_query_renderer
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"query_renderer", 14))
        {
          ret = GLXEW_MESA_query_renderer;
          continue;
        }
#endif
#ifdef GLX_MESA_release_buffers
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"release_buffers", 15))
        {
          ret = GLXEW_MESA_release_buffers;
          continue;
        }
#endif
#ifdef GLX_MESA_set_3dfx_mode
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"set_3dfx_mode", 13))
        {
          ret = GLXEW_MESA_set_3dfx_mode;
          continue;
        }
#endif
#ifdef GLX_MESA_swap_control
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"swap_control", 12))
        {
          ret = GLXEW_MESA_swap_control;
          continue;
        }
#endif
      }
      if (_glewStrSame2(&pos, &len, (const GLubyte*)"NV_", 3))
      {
#ifdef GLX_NV_copy_buffer
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"copy_buffer", 11))
        {
          ret = GLXEW_NV_copy_buffer;
          continue;
        }
#endif
#ifdef GLX_NV_copy_image
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"copy_image", 10))
        {
          ret = GLXEW_NV_copy_image;
          continue;
        }
#endif
#ifdef GLX_NV_delay_before_swap
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"delay_before_swap", 17))
        {
          ret = GLXEW_NV_delay_before_swap;
          continue;
        }
#endif
#ifdef GLX_NV_float_buffer
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"float_buffer", 12))
        {
          ret = GLXEW_NV_float_buffer;
          continue;
        }
#endif
#ifdef GLX_NV_multisample_coverage
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"multisample_coverage", 20))
        {
          ret = GLXEW_NV_multisample_coverage;
          continue;
        }
#endif
#ifdef GLX_NV_present_video
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"present_video", 13))
        {
          ret = GLXEW_NV_present_video;
          continue;
        }
#endif
#ifdef GLX_NV_robustness_video_memory_purge
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"robustness_video_memory_purge", 29))
        {
          ret = GLXEW_NV_robustness_video_memory_purge;
          continue;
        }
#endif
#ifdef GLX_NV_swap_group
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"swap_group", 10))
        {
          ret = GLXEW_NV_swap_group;
          continue;
        }
#endif
#ifdef GLX_NV_vertex_array_range
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"vertex_array_range", 18))
        {
          ret = GLXEW_NV_vertex_array_range;
          continue;
        }
#endif
#ifdef GLX_NV_video_capture
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"video_capture", 13))
        {
          ret = GLXEW_NV_video_capture;
          continue;
        }
#endif
#ifdef GLX_NV_video_out
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"video_out", 9))
        {
          ret = GLXEW_NV_video_out;
          continue;
        }
#endif
      }
      if (_glewStrSame2(&pos, &len, (const GLubyte*)"OML_", 4))
      {
#ifdef GLX_OML_swap_method
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"swap_method", 11))
        {
          ret = GLXEW_OML_swap_method;
          continue;
        }
#endif
#ifdef GLX_OML_sync_control
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"sync_control", 12))
        {
          ret = GLXEW_OML_sync_control;
          continue;
        }
#endif
      }
      if (_glewStrSame2(&pos, &len, (const GLubyte*)"SGIS_", 5))
      {
#ifdef GLX_SGIS_blended_overlay
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"blended_overlay", 15))
        {
          ret = GLXEW_SGIS_blended_overlay;
          continue;
        }
#endif
#ifdef GLX_SGIS_color_range
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"color_range", 11))
        {
          ret = GLXEW_SGIS_color_range;
          continue;
        }
#endif
#ifdef GLX_SGIS_multisample
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"multisample", 11))
        {
          ret = GLXEW_SGIS_multisample;
          continue;
        }
#endif
#ifdef GLX_SGIS_shared_multisample
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"shared_multisample", 18))
        {
          ret = GLXEW_SGIS_shared_multisample;
          continue;
        }
#endif
      }
      if (_glewStrSame2(&pos, &len, (const GLubyte*)"SGIX_", 5))
      {
#ifdef GLX_SGIX_fbconfig
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"fbconfig", 8))
        {
          ret = GLXEW_SGIX_fbconfig;
          continue;
        }
#endif
#ifdef GLX_SGIX_hyperpipe
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"hyperpipe", 9))
        {
          ret = GLXEW_SGIX_hyperpipe;
          continue;
        }
#endif
#ifdef GLX_SGIX_pbuffer
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"pbuffer", 7))
        {
          ret = GLXEW_SGIX_pbuffer;
          continue;
        }
#endif
#ifdef GLX_SGIX_swap_barrier
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"swap_barrier", 12))
        {
          ret = GLXEW_SGIX_swap_barrier;
          continue;
        }
#endif
#ifdef GLX_SGIX_swap_group
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"swap_group", 10))
        {
          ret = GLXEW_SGIX_swap_group;
          continue;
        }
#endif
#ifdef GLX_SGIX_video_resize
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"video_resize", 12))
        {
          ret = GLXEW_SGIX_video_resize;
          continue;
        }
#endif
#ifdef GLX_SGIX_visual_select_group
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"visual_select_group", 19))
        {
          ret = GLXEW_SGIX_visual_select_group;
          continue;
        }
#endif
      }
      if (_glewStrSame2(&pos, &len, (const GLubyte*)"SGI_", 4))
      {
#ifdef GLX_SGI_cushion
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"cushion", 7))
        {
          ret = GLXEW_SGI_cushion;
          continue;
        }
#endif
#ifdef GLX_SGI_make_current_read
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"make_current_read", 17))
        {
          ret = GLXEW_SGI_make_current_read;
          continue;
        }
#endif
#ifdef GLX_SGI_swap_control
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"swap_control", 12))
        {
          ret = GLXEW_SGI_swap_control;
          continue;
        }
#endif
#ifdef GLX_SGI_video_sync
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"video_sync", 10))
        {
          ret = GLXEW_SGI_video_sync;
          continue;
        }
#endif
      }
      if (_glewStrSame2(&pos, &len, (const GLubyte*)"SUN_", 4))
      {
#ifdef GLX_SUN_get_transparent_index
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"get_transparent_index", 21))
        {
          ret = GLXEW_SUN_get_transparent_index;
          continue;
        }
#endif
#ifdef GLX_SUN_video_resize
        if (_glewStrSame3(&pos, &len, (const GLubyte*)"video_resize", 12))
        {
          ret = GLXEW_SUN_video_resize;
          continue;
        }
#endif
      }
    }
    ret = (len == 0);
  }
  return ret;
}